

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall
ON_MorphControl::AddConvexPolygonLocalizer
          (ON_MorphControl *this,ON_SimpleArray<ON_Plane> *planes,double support_distance,
          double falloff_distance)

{
  int iVar1;
  int iVar2;
  ON_Plane *pOVar3;
  ON_Localizer *this_00;
  bool local_91;
  bool local_79;
  ON_Localizer *localizer;
  ON_Plane *plane;
  int iStack_2c;
  bool rc;
  int count;
  int i;
  double falloff_distance_local;
  double support_distance_local;
  ON_SimpleArray<ON_Plane> *planes_local;
  ON_MorphControl *this_local;
  
  iVar1 = ON_SimpleArray<ON_Plane>::Count(planes);
  local_79 = 0.0 <= support_distance && 0.0 < falloff_distance;
  plane._7_1_ = local_79;
  if (0.0 <= support_distance && 0.0 < falloff_distance) {
    iVar2 = ON_ClassArray<ON_Localizer>::Count(&this->m_localizers);
    ON_ClassArray<ON_Localizer>::Reserve(&this->m_localizers,(long)(iVar2 + iVar1));
    iStack_2c = 0;
    while( true ) {
      local_91 = false;
      if (iStack_2c < iVar1) {
        local_91 = plane._7_1_;
      }
      if (local_91 == false) break;
      pOVar3 = ON_SimpleArray<ON_Plane>::operator[](planes,iStack_2c);
      this_00 = ON_ClassArray<ON_Localizer>::AppendNew(&this->m_localizers);
      plane._7_1_ = ON_Localizer::CreatePlaneLocalizer
                              (this_00,pOVar3->origin,pOVar3->zaxis,
                               support_distance + falloff_distance,support_distance);
      iStack_2c = iStack_2c + 1;
    }
  }
  return plane._7_1_;
}

Assistant:

bool ON_MorphControl::AddConvexPolygonLocalizer(
  const ON_SimpleArray<ON_Plane>& planes,
  double support_distance, 
  double falloff_distance
  )
{
  int i, count = planes.Count();
  bool rc = (support_distance >= 0.0 && falloff_distance > 0.0 );
  if (rc)
  {
    m_localizers.Reserve(m_localizers.Count() + count);
    for( i = 0; i < count && rc; i++)
    {
      const ON_Plane& plane = planes[i];
      ON_Localizer& localizer = m_localizers.AppendNew();
      rc = localizer.CreatePlaneLocalizer(
                    plane.origin,plane.zaxis,
                    support_distance+falloff_distance,
                    support_distance);
    }
  }
  return rc;
}